

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int m_select_code_option(aec_stream *strm)

{
  internal_state *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  aec_stream *in_RDI;
  uint32_t se_len;
  uint32_t split_len;
  internal_state *state;
  int local_4;
  
  piVar1 = in_RDI->state;
  if (piVar1->id_len < 2) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = assess_splitting_option((aec_stream *)state);
  }
  uVar3 = assess_se_option(in_RDI);
  if (uVar2 < piVar1->uncomp_len) {
    if (uVar2 < uVar3) {
      local_4 = m_encode_splitting((aec_stream *)CONCAT44(uVar2,uVar3));
    }
    else {
      local_4 = m_encode_se(in_RDI);
    }
  }
  else if (uVar3 < piVar1->uncomp_len) {
    local_4 = m_encode_se(in_RDI);
  }
  else {
    local_4 = m_encode_uncomp((aec_stream *)CONCAT44(uVar2,uVar3));
  }
  return local_4;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    struct internal_state *state = strm->state;

    uint32_t split_len;
    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    uint32_t se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}